

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_protect(CHAR_DATA *ch,char *argument)

{
  long *plVar1;
  CHAR_DATA *arg2;
  ulong uVar2;
  char *txt;
  
  if (*argument == '\0') {
    plVar1 = ch->in_room->room_flags;
    *plVar1 = *plVar1 ^ 0x4000;
    txt = "Ok.\n\r";
  }
  else {
    arg2 = get_char_world(ch,argument);
    if (arg2 != (CHAR_DATA *)0x0) {
      if ((arg2->comm[0] & 0x1000000) == 0) {
        act_new("$N is now snoop-proof.",ch,(void *)0x0,arg2,3,0);
        uVar2 = arg2->comm[0] | 0x1000000;
      }
      else {
        act_new("$N is no longer snoop-proof.",ch,(void *)0x0,arg2,3,0);
        uVar2 = arg2->comm[0] & 0xfffffffffeffffff;
      }
      arg2->comm[0] = uVar2;
      return;
    }
    txt = "You can\'t find them.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_protect(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;

	if (argument[0] == '\0')
	{
		TOGGLE_BIT(ch->in_room->room_flags, ROOM_IMP_ONLY);
		send_to_char("Ok.\n\r", ch);
		return;
	}

	victim = get_char_world(ch, argument);

	if (victim == nullptr)
	{
		send_to_char("You can't find them.\n\r", ch);
		return;
	}

	if (IS_SET(victim->comm, COMM_SNOOP_PROOF))
	{
		act_new("$N is no longer snoop-proof.", ch, nullptr, victim, TO_CHAR, POS_DEAD);
		/*send_to_char("Your snoop-proofing was just removed.\n\r",victim);*/
		REMOVE_BIT(victim->comm, COMM_SNOOP_PROOF);
	}
	else
	{
		act_new("$N is now snoop-proof.", ch, nullptr, victim, TO_CHAR, POS_DEAD);
		/*send_to_char("You are now immune to snooping.\n\r",victim);*/
		SET_BIT(victim->comm, COMM_SNOOP_PROOF);
	}
}